

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_buf_mgr.c
# Opt level: O0

WORD32 ihevc_buf_mgr_release(buf_mgr_t *ps_buf_mgr,WORD32 buf_id,UWORD32 mask)

{
  uint in_EDX;
  int in_ESI;
  int *in_RDI;
  WORD32 local_4;
  
  if (in_ESI < *in_RDI) {
    in_RDI[(long)in_ESI + 2] = (in_EDX ^ 0xffffffff) & in_RDI[(long)in_ESI + 2];
    if (in_RDI[(long)in_ESI + 2] == 2) {
      __assert_fail("(ps_buf_mgr->au4_status[buf_id] != 2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/ihevc_buf_mgr.c"
                    ,0x109,"WORD32 ihevc_buf_mgr_release(buf_mgr_t *, WORD32, UWORD32)");
    }
    if (in_RDI[(long)in_ESI + 2] == 1) {
      in_RDI[(long)in_ESI + 2] = 0;
    }
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

WORD32 ihevc_buf_mgr_release(
                buf_mgr_t *ps_buf_mgr,
                WORD32 buf_id,
                UWORD32 mask)
{
    /* If the given id is pointing to an id which is not yet added */
    if(buf_id >= (WORD32)ps_buf_mgr->u4_max_buf_cnt)
    {
        return (-1);
    }

    ps_buf_mgr->au4_status[buf_id] &= ~mask;
    ASSERT(ps_buf_mgr->au4_status[buf_id] != 2);

    /* If both the REF and DISP are zero, DEC is set to zero */
    if(ps_buf_mgr->au4_status[buf_id] == 1)
    {
        ps_buf_mgr->au4_status[buf_id] = 0;
    }

    return 0;
}